

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::Clamp(Bignum *this)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = this->used_digits_;
  iVar5 = iVar1;
  if (0 < (long)iVar1) {
    iVar2 = (this->bigits_).length_;
    puVar3 = (this->bigits_).start_;
    lVar6 = (long)iVar1;
    do {
      if (iVar2 < iVar1) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      iVar5 = (int)lVar6;
      if (puVar3[lVar6 + -1] != 0) goto LAB_00165931;
      this->used_digits_ = iVar5 + -1;
      bVar4 = 1 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar4);
    iVar5 = 0;
  }
LAB_00165931:
  if (iVar5 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::Clamp() {
  while (used_digits_ > 0 && bigits_[used_digits_ - 1] == 0) {
    used_digits_--;
  }
  if (used_digits_ == 0) {
    // Zero.
    exponent_ = 0;
  }
}